

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptOperator *
cfd::core::ScriptOperator::Get(ScriptOperator *__return_storage_ptr__,string *message)

{
  bool bVar1;
  __type _Var2;
  int __val;
  ulong uVar3;
  char *__nptr;
  InvalidScriptException *this;
  pointer ppVar4;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int iVar5;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar6;
  allocator local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  CfdSourceLocation local_e0;
  iterator local_c8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>
  local_c0;
  iterator local_b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>
  local_b0;
  const_iterator ite;
  string opcode_text;
  string num_str;
  int num;
  undefined1 local_38 [8];
  string search_text;
  string *message_local;
  
  search_text.field_2._8_8_ = message;
  ::std::__cxx11::string::string((string *)local_38,(string *)message);
  bVar1 = ::std::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (bVar1) {
    ::std::__cxx11::string::operator=((string *)local_38,"0");
  }
  else {
    bVar1 = ::std::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee4);
    if (bVar1) {
      ::std::__cxx11::string::operator=((string *)local_38,"-1");
    }
    else {
      uVar3 = ::std::__cxx11::string::length();
      if (3 < uVar3) {
        ::std::__cxx11::string::substr
                  ((ulong)((long)&num_str.field_2 + 8),search_text.field_2._8_8_);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (num_str.field_2._M_local_buf + 8);
        __nptr = (char *)::std::__cxx11::string::c_str();
        __val = atoi(__nptr);
        ::std::__cxx11::string::~string((string *)__rhs);
        iVar5 = __val;
        ::std::__cxx11::to_string((string *)((long)&opcode_text.field_2 + 8),__val);
        ::std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(uVar6,iVar5),__rhs);
        if (((_Var2) && (0 < __val)) && (__val < 0x11)) {
          ::std::__cxx11::string::operator=
                    ((string *)local_38,(string *)(opcode_text.field_2._M_local_buf + 8));
        }
        ::std::__cxx11::string::~string((string *)&ite);
        ::std::__cxx11::string::~string((string *)(opcode_text.field_2._M_local_buf + 8));
      }
    }
  }
  local_b8._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
               *)g_operator_text_map_abi_cxx11_,(key_type *)local_38);
  ::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>
  ::_Rb_tree_const_iterator(&local_b0,&local_b8);
  local_c8._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
              *)g_operator_text_map_abi_cxx11_);
  ::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>
  ::_Rb_tree_const_iterator(&local_c0,&local_c8);
  bVar1 = ::std::operator==(&local_b0,&local_c0);
  if (bVar1) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x1d3;
    local_e0.funcname = "Get";
    logger::warn<>(&local_e0,"target op_code not found.");
    this = (InvalidScriptException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff00,"target op_code not found.",&local_101);
    InvalidScriptException::InvalidScriptException(this,(string *)&stack0xffffffffffffff00);
    __cxa_throw(this,&InvalidScriptException::typeinfo,
                InvalidScriptException::~InvalidScriptException);
  }
  ppVar4 = ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>
           ::operator->(&local_b0);
  ScriptOperator(__return_storage_ptr__,&ppVar4->second);
  ::std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ScriptOperator ScriptOperator::Get(const std::string& message) {
  std::string search_text = message;
  if (message == "OP_0") {
    search_text = "0";
  } else if (message == "OP_1NEGATE") {
    search_text = "-1";
  } else if (message.length() >= 4) {
    int num = std::atoi(message.substr(3).c_str());
    std::string num_str = std::to_string(num);
    std::string opcode_text = "OP_" + num_str;
    if ((message == opcode_text) && (num >= 1) && (num <= 16)) {
      search_text = num_str;
    }
  }
  decltype(g_operator_text_map)::const_iterator ite =
      g_operator_text_map.find(search_text);
  if (ite == g_operator_text_map.end()) {
    warn(CFD_LOG_SOURCE, "target op_code not found.");
    throw InvalidScriptException("target op_code not found.");
  }
  return ite->second;
}